

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLrelation.c
# Opt level: O0

void make_edge_list(uint **edge_list,uint *edge_list_size,char *edges,RDL_graph *graph,RDL_cfam *rcf
                   ,RDL_sPathInfo *spi)

{
  uint *puVar1;
  uint local_40;
  uint local_3c;
  uint i;
  uint alloced;
  RDL_sPathInfo *spi_local;
  RDL_cfam *rcf_local;
  RDL_graph *graph_local;
  char *edges_local;
  uint *edge_list_size_local;
  uint **edge_list_local;
  
  memset(edges,0,(ulong)graph->E);
  RDL_findEdges(edges,rcf,graph,spi);
  local_3c = 0x40;
  puVar1 = (uint *)malloc(0x100);
  *edge_list = puVar1;
  for (local_40 = 0; local_40 < graph->E; local_40 = local_40 + 1) {
    if (edges[local_40] != '\0') {
      if (*edge_list_size == local_3c) {
        local_3c = local_3c << 1;
        puVar1 = (uint *)realloc(*edge_list,(ulong)local_3c << 2);
        *edge_list = puVar1;
      }
      (*edge_list)[*edge_list_size] = local_40;
      *edge_list_size = *edge_list_size + 1;
    }
  }
  puVar1 = (uint *)realloc(*edge_list,(ulong)*edge_list_size << 2);
  *edge_list = puVar1;
  return;
}

Assistant:

static void make_edge_list(
    unsigned** edge_list,
    unsigned* edge_list_size,
    char* edges, RDL_graph *graph,
    RDL_cfam* rcf, RDL_sPathInfo* spi)
{
  unsigned alloced, i;

  memset(edges, 0, graph->E * sizeof(*edges));
  RDL_findEdges(edges, rcf, graph, spi);

  alloced = 64;
  *edge_list = malloc(alloced * sizeof(**edge_list));

  for (i = 0; i < graph->E; ++i) {
    if (edges[i]) {
      if (*edge_list_size == alloced) {
        alloced *= 2;
        *edge_list = realloc(*edge_list, alloced * sizeof(**edge_list));
      }
      (*edge_list)[*edge_list_size] = i;
      ++(*edge_list_size);
    }
  }
  *edge_list = realloc(*edge_list, *edge_list_size * sizeof(**edge_list));
}